

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SugarConvDsk_Conversion_2IPF_Test::TestBody(SugarConvDsk_Conversion_2IPF_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *out_file_00;
  char *conversion_options;
  ostream *poVar3;
  Message *message;
  char *in_R9;
  string local_5d0;
  AssertHelper local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_;
  string local_550;
  string local_530;
  allocator<char> local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [8];
  string options;
  path local_488;
  undefined1 local_448 [8];
  path out_file;
  path local_3c8;
  undefined1 local_388 [8];
  path in_file;
  undefined1 local_328 [8];
  string out_filename;
  path local_2c8;
  undefined1 local_288 [8];
  string filename_to_test;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *ext;
  undefined1 local_220 [8];
  vector<FormatType_*,_std::allocator<FormatType_*>_> list_formats;
  DiskBuilder disk_builder;
  string error_string;
  stringstream local_1b8 [8];
  stringstream str;
  ostream local_1a8 [376];
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  bool test_ok;
  SugarConvDsk_Conversion_2IPF_Test *this_local;
  
  file_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::string::string
            ((string *)
             &disk_builder.format_list_.
              super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  DiskBuilder::DiskBuilder
            ((DiskBuilder *)
             &list_formats.super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  DiskBuilder::GetFormatsList
            ((vector<FormatType_*,_std::allocator<FormatType_*>_> *)local_220,
             (DiskBuilder *)
             &list_formats.super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,WRITE);
  std::experimental::filesystem::v1::__cxx11::path::string((string *)&ext,&dump_dir_abi_cxx11_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  GetDirectoryContent(pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_30);
  std::__cxx11::string::~string((string *)&ext);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30);
  it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&it), bVar1) {
    filename_to_test.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              ((path *)((long)&out_filename.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               filename_to_test.field_2._8_8_);
    std::experimental::filesystem::v1::__cxx11::path::filename
              (&local_2c8,(path *)((long)&out_filename.field_2 + 8));
    std::experimental::filesystem::v1::__cxx11::path::string((string *)local_288,&local_2c8);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_2c8);
    std::experimental::filesystem::v1::__cxx11::path::~path
              ((path *)((long)&out_filename.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &in_file._M_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   ".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &in_file._M_type,"IPF");
    std::__cxx11::string::~string((string *)&in_file._M_type);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_3c8,&dump_dir_abi_cxx11_);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              ((path *)&out_file._M_type,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
    std::experimental::filesystem::v1::__cxx11::operator/
              ((path *)local_388,&local_3c8,(path *)&out_file._M_type);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)&out_file._M_type);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_3c8);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_488,&out_dir_abi_cxx11_);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              ((path *)((long)&options.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    std::experimental::filesystem::v1::__cxx11::operator/
              ((path *)local_448,&local_488,(path *)((long)&options.field_2 + 8));
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)((long)&options.field_2 + 8));
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"-o=",&local_509);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                   &local_508,"IPF");
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::experimental::filesystem::v1::__cxx11::path::string(&local_530,(path *)local_388);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::experimental::filesystem::v1::__cxx11::path::string(&local_550,(path *)local_448);
    out_file_00 = (char *)std::__cxx11::string::c_str();
    conversion_options = (char *)std::__cxx11::string::c_str();
    bVar1 = CompareConversion(pcVar2,out_file_00,conversion_options,
                              (string *)
                              &disk_builder.format_list_.
                               super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_530);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      file_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      poVar3 = std::operator<<(local_1a8,"Error : ");
      std::experimental::filesystem::v1::__cxx11::path::string
                ((string *)&gtest_ar_.message_,(path *)local_388);
      poVar3 = std::operator<<(poVar3,(string *)&gtest_ar_.message_);
      poVar3 = std::operator<<(poVar3," -> ");
      poVar3 = std::operator<<(poVar3,"IPF");
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &disk_builder.format_list_.
                                       super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    }
    std::__cxx11::string::~string((string *)local_4e8);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_448);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_388);
    std::__cxx11::string::~string((string *)local_328);
    std::__cxx11::string::~string((string *)local_288);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_580,
             (bool *)((long)&file_list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    std::__cxx11::stringstream::str();
    message = testing::Message::operator<<(&local_588,&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5d0,(internal *)local_580,(AssertionResult *)"test_ok","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Tom1975[P]SugarConvDsk/Tests/test.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5b0,message);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5a8);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  std::vector<FormatType_*,_std::allocator<FormatType_*>_>::~vector
            ((vector<FormatType_*,_std::allocator<FormatType_*>_> *)local_220);
  DiskBuilder::~DiskBuilder
            ((DiskBuilder *)
             &list_formats.super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &disk_builder.format_list_.
              super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

TEST(SugarConvDsk, Conversion_2IPF)
{
	bool test_ok = true;
	std::vector<std::string> file_list;
	std::stringstream str;
	std::string error_string;

	DiskBuilder disk_builder;
	std::vector<FormatType*> list_formats = disk_builder.GetFormatsList(DiskBuilder::WRITE);

	GetDirectoryContent(dump_dir.string().c_str(), file_list);
	
	const char* ext = "IPF";
	for (auto&it : file_list)
	{
		const std::string filename_to_test = fs::path(it).filename().string();
		const std::string out_filename = filename_to_test + "." + ext;

		const fs::path in_file = fs::path(dump_dir) / filename_to_test;
		const fs::path out_file = fs::path(out_dir) / out_filename;

		std::string options = std::string("-o=") + ext;

 		if (!CompareConversion(in_file.string().c_str(), out_file.string().c_str(), options.c_str(), error_string))
		{
			test_ok = false;
			str << "Error : " << in_file.string() << " -> "<< ext <<" : "<< error_string << "\n";
		}
	}
	ASSERT_TRUE(test_ok) << str.str();
}